

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O1

Value<char> * __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,Char_T *key,SizeT length)

{
  uint uVar1;
  uint uVar2;
  SizeT *pSVar3;
  SizeT SVar4;
  SizeT SVar5;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar6;
  char *to;
  Value<char> *pVVar7;
  SizeT *index;
  SizeT *local_48;
  String<char> local_40;
  
  SVar4 = (this->
          super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          ).capacity_;
  if ((this->
      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      ).index_ == SVar4) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    resize(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ,(SVar4 + (SVar4 == 0)) * 2);
  }
  SVar4 = StringUtils::Hash<char>(key,length);
  pHVar6 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                  ,&local_48,key,length,SVar4);
  if (pHVar6 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    local_40.storage_ = (char *)0x0;
    local_40.length_ = 0;
    to = String<char>::allocate(&local_40,length + 1);
    Memory::Copy<unsigned_int>(to,key,length);
    to[length] = '\0';
    uVar1 = (this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ).index_;
    uVar2 = (this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ).capacity_;
    pSVar3 = (this->
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ).hashTable_;
    SVar5 = uVar1 + 1;
    (this->
    super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
    ).index_ = SVar5;
    *local_48 = SVar5;
    pVVar7 = (Value<char> *)(pSVar3 + (ulong)uVar2 + (ulong)uVar1 * 0xc + 6);
    ((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar7 + -1))->Hash = SVar4;
    ((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar7 + -1))->Next = 0;
    (((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar7 + -1))->Key).storage_ =
         local_40.storage_;
    (((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar7 + -1))->Key).length_ = length;
    local_40.length_ = 0;
    local_40.storage_ = (char *)0x0;
    operator_delete((void *)0x0);
    pVVar7->type_ = Undefined;
    (pVVar7->field_0).array_.storage_ = (Value<char> *)0x0;
    *(SizeT *)((long)&pVVar7->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar7->field_0 + 0xc) = 0;
  }
  else {
    pVVar7 = &pHVar6->Value;
  }
  return pVVar7;
}

Assistant:

Value_T &Get(const Char_T *key, const SizeT length) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key, length);
        SizeT      *index;
        HItem      *item = find(index, key, length, hash);

        if (item != nullptr) {
            return item->Value;
        }

        item = insert(index, Key_T{key, length}, hash);
        Memory::Initialize(&(item->Value));

        return item->Value;
    }